

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-messages.c
# Opt level: O0

void borg_free_messages(void)

{
  int local_c;
  int i;
  
  mem_free(borg_msg_use);
  borg_msg_use = (int16_t *)0x0;
  mem_free(borg_msg_pos);
  borg_msg_pos = (int16_t *)0x0;
  borg_msg_num = 0;
  mem_free(borg_msg_buf);
  borg_msg_buf = (char *)0x0;
  borg_msg_siz = 0;
  if (suffix_pain != (char **)0x0) {
    for (local_c = 0; suffix_pain[local_c] != (char *)0x0; local_c = local_c + 1) {
      mem_free(suffix_pain[local_c]);
      suffix_pain[local_c] = (char *)0x0;
    }
    mem_free(suffix_pain);
    suffix_pain = (char **)0x0;
  }
  clean_msgs(&suffix_hit_by);
  clean_msgs(&spell_invis_msgs);
  clean_msgs(&spell_msgs);
  return;
}

Assistant:

void borg_free_messages(void)
{
    int i;

    mem_free(borg_msg_use);
    borg_msg_use = NULL;
    mem_free(borg_msg_pos);
    borg_msg_pos = NULL;
    borg_msg_num = 0;
    mem_free(borg_msg_buf);
    borg_msg_buf = NULL;
    borg_msg_siz = 0;

    if (suffix_pain) {
        for (i = 0; suffix_pain[i]; ++i) {
            mem_free(suffix_pain[i]);
            suffix_pain[i] = NULL;
        }
        mem_free(suffix_pain);
        suffix_pain = NULL;
    }
    clean_msgs(&suffix_hit_by);
    clean_msgs(&spell_invis_msgs);
    clean_msgs(&spell_msgs);
}